

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetWindowConditionAllowFlags(ImGuiWindow *window,ImGuiCond flags,bool enabled)

{
  uint local_1c;
  uint local_18;
  uint local_14;
  bool enabled_local;
  ImGuiCond flags_local;
  ImGuiWindow *window_local;
  
  if (enabled) {
    local_14 = window->SetWindowPosAllowFlags | flags;
  }
  else {
    local_14 = window->SetWindowPosAllowFlags & (flags ^ 0xffffffffU);
  }
  window->SetWindowPosAllowFlags = local_14;
  if (enabled) {
    local_18 = window->SetWindowSizeAllowFlags | flags;
  }
  else {
    local_18 = window->SetWindowSizeAllowFlags & (flags ^ 0xffffffffU);
  }
  window->SetWindowSizeAllowFlags = local_18;
  if (enabled) {
    local_1c = window->SetWindowCollapsedAllowFlags | flags;
  }
  else {
    local_1c = window->SetWindowCollapsedAllowFlags & (flags ^ 0xffffffffU);
  }
  window->SetWindowCollapsedAllowFlags = local_1c;
  return;
}

Assistant:

static void SetWindowConditionAllowFlags(ImGuiWindow* window, ImGuiCond flags, bool enabled)
{
    window->SetWindowPosAllowFlags       = enabled ? (window->SetWindowPosAllowFlags       | flags) : (window->SetWindowPosAllowFlags       & ~flags);
    window->SetWindowSizeAllowFlags      = enabled ? (window->SetWindowSizeAllowFlags      | flags) : (window->SetWindowSizeAllowFlags      & ~flags);
    window->SetWindowCollapsedAllowFlags = enabled ? (window->SetWindowCollapsedAllowFlags | flags) : (window->SetWindowCollapsedAllowFlags & ~flags);
}